

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O2

int __thiscall ZXing::Pdf417::BarcodeMatrix::init(BarcodeMatrix *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int iVar1;
  int in_EDX;
  ulong uVar2;
  ulong uVar3;
  
  std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::resize
            (&this->_matrix,(long)(int)ctx);
  uVar2 = 0;
  uVar3 = (ulong)ctx & 0xffffffff;
  if ((int)ctx < 1) {
    uVar3 = uVar2;
  }
  iVar1 = extraout_EAX;
  for (; uVar3 * 0x30 - uVar2 != 0; uVar2 = uVar2 + 0x30) {
    iVar1 = BarcodeRow::init((BarcodeRow *)
                             ((long)&(((this->_matrix).
                                       super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_row).
                                     super__Bvector_base<std::allocator<bool>_> + uVar2),
                             (EVP_PKEY_CTX *)(ulong)(in_EDX * 0x11 + 0x45));
  }
  this->_width = in_EDX * 0x11;
  this->_currentRow = -1;
  return iVar1;
}

Assistant:

void init(int height, int width) {
		_matrix.resize(height);
		for (int i = 0; i < height; ++i) {
			_matrix[i].init((width + 4) * 17 + 1);
		}
		_width = width * 17;
		_currentRow = -1;
	}